

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::rec_delete
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *sib)

{
  Siblings *sib_00;
  stored_size_type sVar1;
  pointer ppVar2;
  pointer ppVar3;
  
  ppVar2 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  ppVar3 = ppVar2;
  if (sVar1 != 0) {
    do {
      sib_00 = (ppVar3->second).children_;
      if (sib_00->parent_ == ppVar3->first) {
        rec_delete(this,sib_00);
        ppVar2 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
        sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2 + sVar1);
  }
  if ((sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_capacity != 0) {
    operator_delete(ppVar2);
  }
  operator_delete(sib,0x28);
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }